

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase34::run(TestCase34 *this)

{
  int iVar1;
  char buf [7];
  int fds [2];
  FdInputStream in;
  FdOutputStream out;
  undefined4 local_a7;
  char acStack_a3 [2];
  char local_a1;
  AutoCloseFd local_a0;
  int local_98;
  int local_94;
  FdInputStream local_90;
  AutoCloseFd local_78;
  FdOutputStream local_70;
  undefined8 local_58;
  undefined8 uStack_50;
  char *local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  char *local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  do {
    iVar1 = pipe(&local_98);
    if (-1 < iVar1) goto LAB_00166add;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_90.super_InputStream._vptr_InputStream = (_func_int **)0x0;
    local_58 = 0;
    uStack_50 = 0;
    _::Debug::Fault::init
              ((Fault *)&local_90,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io-test.c++"
              );
    _::Debug::Fault::fatal((Fault *)&local_90);
  }
LAB_00166add:
  local_a0.fd = local_98;
  UnwindDetector::UnwindDetector(&local_a0.unwindDetector);
  FdInputStream::FdInputStream(&local_90,&local_a0);
  AutoCloseFd::~AutoCloseFd(&local_a0);
  local_78.fd = local_94;
  UnwindDetector::UnwindDetector(&local_78.unwindDetector);
  FdOutputStream::FdOutputStream(&local_70,&local_78);
  AutoCloseFd::~AutoCloseFd(&local_78);
  local_58 = 0;
  uStack_50 = 0;
  local_48 = "foo";
  local_40 = 3;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = "bar";
  local_20 = 3;
  local_18 = 0;
  uStack_10 = 0;
  FdOutputStream::write(&local_70,(int)&local_58,(void *)0x5,0x188b33);
  InputStream::read(&local_90.super_InputStream,(int)(char (*) [7])&local_a7,(void *)0x6,6);
  local_a1 = '\0';
  if ((CONCAT21(acStack_a3,local_a7._3_1_) != 0x726162 || local_a7 != 0x626f6f66) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[46],char_const(&)[7],char(&)[7]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io-test.c++"
               ,0x3a,ERROR,
               "\"failed: expected \" \"::strcmp(\\\"foobar\\\", buf) == 0\", \"foobar\", buf",
               (char (*) [46])"failed: expected ::strcmp(\"foobar\", buf) == 0",
               (char (*) [7])"foobar",(char (*) [7])&local_a7);
  }
  FdOutputStream::~FdOutputStream(&local_70);
  FdInputStream::~FdInputStream(&local_90);
  return;
}

Assistant:

TEST(Io, WriteVec) {
  // Check that writing an array of arrays works even when some of the arrays are empty.  (This
  // used to not work in some cases.)

  int fds[2];
  KJ_SYSCALL(miniposix::pipe(fds));

  FdInputStream in((AutoCloseFd(fds[0])));
  FdOutputStream out((AutoCloseFd(fds[1])));

  ArrayPtr<const byte> pieces[5] = {
    arrayPtr(implicitCast<const byte*>(nullptr), 0),
    arrayPtr(reinterpret_cast<const byte*>("foo"), 3),
    arrayPtr(implicitCast<const byte*>(nullptr), 0),
    arrayPtr(reinterpret_cast<const byte*>("bar"), 3),
    arrayPtr(implicitCast<const byte*>(nullptr), 0)
  };

  out.write(pieces);

  char buf[7];
  in.read(buf, 6);
  buf[6] = '\0';

  EXPECT_STREQ("foobar", buf);
}